

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DSAParameters.cpp
# Opt level: O0

ByteString * __thiscall DSAParameters::serialise(DSAParameters *this)

{
  ByteString *in_RDI;
  ByteString *in_stack_ffffffffffffff50;
  ByteString *in_stack_ffffffffffffff58;
  ByteString *in_stack_ffffffffffffff78;
  
  ByteString::serialise(in_stack_ffffffffffffff78);
  ByteString::serialise(in_stack_ffffffffffffff78);
  operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  ByteString::serialise(in_stack_ffffffffffffff78);
  operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  ByteString::~ByteString((ByteString *)0x1a6343);
  ByteString::~ByteString((ByteString *)0x1a6350);
  ByteString::~ByteString((ByteString *)0x1a635a);
  ByteString::~ByteString((ByteString *)0x1a6364);
  return in_RDI;
}

Assistant:

ByteString DSAParameters::serialise() const
{
	return p.serialise() + q.serialise() + g.serialise();
}